

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

void xemmai::t_type_of<xemmai::t_map>::f_define(void)

{
  t_global *ptVar1;
  wstring_view a_value;
  wstring_view a_value_00;
  wstring_view a_value_01;
  wstring_view a_value_02;
  t_define<xemmai::t_global> *ptVar2;
  t_object *ptVar3;
  long in_FS_OFFSET;
  wchar_t *in_stack_ffffffffffffffa8;
  t_define<xemmai::t_global> local_50;
  
  ptVar1 = *(t_global **)(in_FS_OFFSET + -0x78);
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.v_library = ptVar1;
  t_define<xemmai::t_global>::f_derive<xemmai::t_map::t_table,xemmai::t_object>(&local_50);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_50.v_fields.v_class);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector
            (&local_50.v_fields.v_instance);
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.v_library = ptVar1;
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (&local_50,(ptVar1->v_symbol_string).v_p._M_b._M_p,
                      t_member<xemmai::t_object_*(*)(xemmai::t_map_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  a_value._M_str = in_stack_ffffffffffffffa8;
  a_value._M_len = 0x162c8f;
  ptVar3 = t_symbol::f_instantiate(a_value);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,ptVar3,
                      t_member<void_(*)(xemmai::t_map_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,(ptVar1->v_symbol_size).v_p._M_b._M_p,
                      t_member<unsigned_long_(*)(xemmai::t_map_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,(ptVar1->v_symbol_get_at).v_p._M_b._M_p,
                      t_member<xemmai::t_value<xemmai::t_pointer>_(*)(xemmai::t_map_&,_const_xemmai::t_value<xemmai::t_pointer>_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,(ptVar1->v_symbol_set_at).v_p._M_b._M_p,
                      t_member<xemmai::t_value<xemmai::t_pointer>_(*)(xemmai::t_map_&,_const_xemmai::t_value<xemmai::t_pointer>_&,_const_xemmai::t_value<xemmai::t_pointer>_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  a_value_00._M_str = in_stack_ffffffffffffffa8;
  a_value_00._M_len = 0x162cf7;
  ptVar3 = t_symbol::f_instantiate(a_value_00);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,ptVar3,
                      t_member<bool_(*)(xemmai::t_map_&,_const_xemmai::t_value<xemmai::t_pointer>_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  a_value_01._M_str = in_stack_ffffffffffffffa8;
  a_value_01._M_len = 0x162d1d;
  ptVar3 = t_symbol::f_instantiate(a_value_01);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,ptVar3,
                      t_member<xemmai::t_value<xemmai::t_pointer>_(*)(xemmai::t_map_&,_const_xemmai::t_value<xemmai::t_pointer>_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  a_value_02._M_str = in_stack_ffffffffffffffa8;
  a_value_02._M_len = 0x162d43;
  ptVar3 = t_symbol::f_instantiate(a_value_02);
  ptVar2 = t_define<xemmai::t_global>::operator()
                     (ptVar2,ptVar3,
                      t_member<void_(*)(xemmai::t_map_&,_const_xemmai::t_value<xemmai::t_pointer>_&),_&xemmai::t_type_of<xemmai::t_map>::f_define()::(anonymous_class)::__invoke>
                      ::t_bind<xemmai::t_global>::f_call);
  t_define<xemmai::t_global>::f_derive<xemmai::t_map,xemmai::t_sharable>(ptVar2);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_50.v_fields.v_class);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector
            (&local_50.v_fields.v_instance);
  return;
}

Assistant:

size_t t_type_of<t_map>::f_do_set_at(t_object* a_this, t_pvalue* a_stack)
{
	auto& map = a_this->f_as<t_map>();
	map.f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		a_stack[0] = map.f_put(a_stack[2], a_stack[3]);
	});
	return -1;
}